

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O0

void learn(sender *s,single_learner *param_2,example *ec)

{
  ulong uVar1;
  v_array<char> tag;
  size_t in_RDX;
  undefined8 *in_RDI;
  sender *in_stack_ffffffffffffffb0;
  io_buf *in_stack_ffffffffffffffc0;
  example *ec_00;
  io_buf *b;
  
  if (in_RDI[5] + (*(ulong *)(*(long *)(in_RDI[2] + 8) + 0x218) >> 1) + -1 == in_RDI[4]) {
    receive_result(in_stack_ffffffffffffffb0);
  }
  (**(code **)(in_RDI[2] + 0x40))(*(undefined4 *)(in_RDX + 0x6828),*(undefined8 *)in_RDI[2]);
  (**(code **)(*(long *)(in_RDI[2] + 8) + 0x340))(in_RDX + 0x6828,*in_RDI);
  ec_00 = *(example **)(in_RDX + 0x6878);
  b = *(io_buf **)*(undefined1 (*) [24])(in_RDX + 0x6880);
  tag.erase_count = in_RDX;
  tag._0_24_ = *(undefined1 (*) [24])(in_RDX + 0x6880);
  cache_tag(in_stack_ffffffffffffffc0,tag);
  send_features(b,ec_00,(uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  uVar1 = in_RDI[4];
  in_RDI[4] = uVar1 + 1;
  *(size_t *)(in_RDI[3] + (uVar1 % *(ulong *)(*(long *)(in_RDI[2] + 8) + 0x218)) * 8) = in_RDX;
  return;
}

Assistant:

void learn(sender& s, LEARNER::single_learner&, example& ec)
{
  if (s.received_index + s.all->p->ring_size / 2 - 1 == s.sent_index)
    receive_result(s);

  s.all->set_minmax(s.all->sd, ec.l.simple.label);
  s.all->p->lp.cache_label(&ec.l, *s.buf);  // send label information.
  cache_tag(*s.buf, ec.tag);
  send_features(s.buf, ec, (uint32_t)s.all->parse_mask);
  s.delay_ring[s.sent_index++ % s.all->p->ring_size] = &ec;
}